

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * fkActionTrigger(Parse *pParse,Table *pTab,FKey *pFKey,ExprList *pChanges)

{
  char cVar1;
  long lVar2;
  sqlite3 *db_00;
  void *__src;
  long lVar3;
  u8 uVar4;
  uint uVar5;
  int iVar6;
  Column *pCol_00;
  Expr *pEVar7;
  SrcList *pSVar8;
  char *pcVar9;
  Schema *pSVar10;
  Select *pSVar11;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Expr *pRaise;
  SrcList *pSrc;
  int iDb;
  Expr *pDflt;
  Column *pCol;
  Expr *pNew;
  Expr *pEq;
  int iFromCol;
  Expr *pWhen;
  int i;
  Select *pSelect;
  ExprList *pList;
  Expr *pWhere;
  TriggerStep *pStep;
  int nFrom;
  char *zFrom;
  int iAction;
  Trigger *pTrigger;
  int action;
  sqlite3 *db;
  Token tToCol;
  Token tFromCol;
  Token tNew;
  Token tOld;
  int *aiCol;
  Index *pIdx;
  Select *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  sqlite3 *in_stack_fffffffffffffe48;
  sqlite3 *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  u16 uVar12;
  int in_stack_fffffffffffffe5c;
  sqlite3 *in_stack_fffffffffffffe60;
  int flags;
  sqlite3 *in_stack_fffffffffffffe68;
  sqlite3 *in_stack_fffffffffffffe70;
  sqlite3 *in_stack_fffffffffffffe78;
  int flags_00;
  Expr *in_stack_fffffffffffffe80;
  sqlite3 *in_stack_fffffffffffffe88;
  Table *in_stack_fffffffffffffe90;
  Parse *in_stack_fffffffffffffe98;
  Expr *local_108;
  Expr *in_stack_ffffffffffffff10;
  u32 in_stack_ffffffffffffff18;
  Expr *pEVar13;
  int local_d4;
  TriggerStep *local_b8;
  Trigger *local_98;
  Trigger *local_60;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = (sqlite3 *)in_RDI->pVfs;
  uVar5 = (uint)(in_RCX != 0);
  cVar1 = *(char *)((long)in_RDX + (long)(int)uVar5 + 0x2d);
  if ((db_00->flags & 0x800000000) != 0) {
    cVar1 = '\0';
  }
  if ((cVar1 == '\a') && ((db_00->flags & 0x80000) != 0)) {
    local_60 = (Trigger *)0x0;
    goto LAB_00217d9d;
  }
  local_98 = (Trigger *)in_RDX[(long)(int)uVar5 + 6];
  if ((cVar1 != '\0') && (local_98 == (Trigger *)0x0)) {
    local_b8 = (TriggerStep *)0x0;
    pEVar13 = (Expr *)0x0;
    iVar6 = sqlite3FkLocateIndex
                      (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                       (FKey *)in_stack_fffffffffffffe88,(Index **)in_stack_fffffffffffffe80,
                       (int **)in_stack_fffffffffffffe78);
    if (iVar6 != 0) {
      local_60 = (Trigger *)0x0;
      goto LAB_00217d9d;
    }
    for (local_d4 = 0; local_d4 < (int)in_RDX[5]; local_d4 = local_d4 + 1) {
      lVar3 = in_RDX[8];
      sqlite3TokenInit((Token *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (char *)in_stack_fffffffffffffe38);
      sqlite3TokenInit((Token *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (char *)in_stack_fffffffffffffe38);
      sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                       (Token *)in_stack_fffffffffffffe50,
                       (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                       (Token *)in_stack_fffffffffffffe50,
                       (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                   (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                   (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (Expr *)in_stack_fffffffffffffe38);
      sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                       (Token *)in_stack_fffffffffffffe50,
                       (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      in_stack_ffffffffffffff10 =
           sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                        (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                        (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        (Expr *)in_stack_fffffffffffffe38);
      sqlite3ExprAnd((Parse *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (Expr *)in_stack_fffffffffffffe50,(Expr *)in_stack_fffffffffffffe48);
      if (in_RCX != 0) {
        in_stack_fffffffffffffe78 = in_RDI;
        in_stack_fffffffffffffe80 =
             sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                              (Token *)in_stack_fffffffffffffe50,
                              (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
        sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         (Token *)in_stack_fffffffffffffe50,
                         (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
        sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (Expr *)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe88 = in_RDI;
        sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         (Token *)in_stack_fffffffffffffe50,
                         (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
        sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         (Token *)in_stack_fffffffffffffe50,
                         (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
        sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (Expr *)in_stack_fffffffffffffe38);
        in_stack_ffffffffffffff10 =
             sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                          (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                          (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (Expr *)in_stack_fffffffffffffe38);
        pEVar13 = sqlite3ExprAnd((Parse *)CONCAT44(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58),
                                 (Expr *)in_stack_fffffffffffffe50,(Expr *)in_stack_fffffffffffffe48
                                );
      }
      if ((cVar1 != '\a') && ((cVar1 != '\n' || (in_RCX != 0)))) {
        iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
        if (cVar1 == '\n') {
          in_stack_fffffffffffffe68 = in_RDI;
          in_stack_fffffffffffffe70 =
               (sqlite3 *)
               sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                                (Token *)in_stack_fffffffffffffe50,iVar6);
          sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                           (Token *)in_stack_fffffffffffffe50,
                           (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                       (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                       (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (Expr *)in_stack_fffffffffffffe38);
        }
        else if (cVar1 == '\t') {
          pCol_00 = (Column *)(*(long *)(*in_RDX + 8) + (long)(int)lVar3 * 0x10);
          if ((pCol_00->colFlags & 0x60) == 0) {
            local_108 = sqlite3ColumnExpr((Table *)*in_RDX,pCol_00);
          }
          else {
            local_108 = (Expr *)0x0;
          }
          if (local_108 == (Expr *)0x0) {
            sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                             (Token *)in_stack_fffffffffffffe50,
                             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          }
          else {
            sqlite3ExprDup(in_stack_fffffffffffffe50,(Expr *)in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe44);
          }
        }
        else {
          sqlite3ExprAlloc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                           (Token *)in_stack_fffffffffffffe50,iVar6);
        }
        sqlite3ExprListAppend
                  ((Parse *)in_stack_fffffffffffffe48,
                   (ExprList *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (Expr *)in_stack_fffffffffffffe38);
        sqlite3ExprListSetName
                  ((Parse *)in_stack_fffffffffffffe50,(ExprList *)in_stack_fffffffffffffe48,
                   (Token *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      }
    }
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                  in_stack_fffffffffffffe38);
    __src = *(void **)*in_RDX;
    iVar6 = sqlite3Strlen30((char *)in_stack_fffffffffffffe38);
    if (cVar1 == '\a') {
      sqlite3SchemaToIndex(db_00,*(Schema **)(in_RSI + 0x60));
      sqlite3Expr(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                  (char *)in_stack_fffffffffffffe38);
      pEVar7 = sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                            (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                            (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            (Expr *)in_stack_fffffffffffffe38);
      if (pEVar7 != (Expr *)0x0) {
        pEVar7->affExpr = '\x02';
      }
      pSVar8 = sqlite3SrcListAppend
                         ((Parse *)in_stack_fffffffffffffe68,(SrcList *)in_stack_fffffffffffffe60,
                          (Token *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                          (Token *)in_stack_fffffffffffffe50);
      if (pSVar8 != (SrcList *)0x0) {
        pcVar9 = sqlite3DbStrDup(in_stack_fffffffffffffe48,
                                 (char *)CONCAT44(in_stack_fffffffffffffe44,
                                                  in_stack_fffffffffffffe40));
        pSVar8->a[0].zName = pcVar9;
        pcVar9 = sqlite3DbStrDup(in_stack_fffffffffffffe48,
                                 (char *)CONCAT44(in_stack_fffffffffffffe44,
                                                  in_stack_fffffffffffffe40));
        pSVar8->a[0].u4.zDatabase = pcVar9;
      }
      sqlite3ExprListAppend
                ((Parse *)in_stack_fffffffffffffe48,
                 (ExprList *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (Expr *)in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe38 = (Select *)0x0;
      in_stack_fffffffffffffe40 = 0;
      in_stack_fffffffffffffe48 = (sqlite3 *)0x0;
      sqlite3SelectNew((Parse *)in_stack_fffffffffffffe78,(ExprList *)in_stack_fffffffffffffe70,
                       (SrcList *)in_stack_fffffffffffffe68,(Expr *)in_RDI,
                       (ExprList *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (Expr *)in_stack_fffffffffffffe50,(ExprList *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff18,pEVar13);
      in_stack_fffffffffffffe60 = in_RDI;
    }
    flags = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    flags_00 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    (db_00->lookaside).bDisable = (db_00->lookaside).bDisable + 1;
    (db_00->lookaside).sz = 0;
    local_98 = (Trigger *)
               sqlite3DbMallocZero((sqlite3 *)
                                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                   (u64)in_stack_fffffffffffffe38);
    if (local_98 != (Trigger *)0x0) {
      local_b8 = (TriggerStep *)(local_98 + 1);
      local_98->step_list = local_b8;
      local_98[1].pWhen = (Expr *)&local_98[2].pWhen;
      memcpy(local_98[1].pWhen,__src,(long)iVar6);
      pSVar10 = (Schema *)
                sqlite3ExprDup(in_stack_fffffffffffffe50,(Expr *)in_stack_fffffffffffffe48,
                               in_stack_fffffffffffffe44);
      local_98[1].pSchema = pSVar10;
      pSVar10 = (Schema *)
                sqlite3ExprListDup(in_stack_fffffffffffffe88,(ExprList *)in_stack_fffffffffffffe80,
                                   flags_00);
      local_98[1].pTabSchema = pSVar10;
      pSVar11 = sqlite3SelectDup(in_stack_fffffffffffffe70,(Select *)in_stack_fffffffffffffe68,flags
                                );
      *(Select **)&local_98[1].op = pSVar11;
      if (pEVar13 != (Expr *)0x0) {
        sqlite3PExpr((Parse *)in_stack_fffffffffffffe50,
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (Expr *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (Expr *)in_stack_fffffffffffffe38);
        pEVar13 = sqlite3ExprDup(in_stack_fffffffffffffe50,(Expr *)in_stack_fffffffffffffe48,
                                 in_stack_fffffffffffffe44);
        local_98->pWhen = pEVar13;
      }
    }
    (db_00->lookaside).bDisable = (db_00->lookaside).bDisable - 1;
    if ((db_00->lookaside).bDisable == 0) {
      uVar12 = (db_00->lookaside).szTrue;
    }
    else {
      uVar12 = 0;
    }
    (db_00->lookaside).sz = uVar12;
    sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                      (Expr *)in_stack_fffffffffffffe38);
    sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                      (Expr *)in_stack_fffffffffffffe38);
    sqlite3ExprListDelete
              ((sqlite3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (ExprList *)in_stack_fffffffffffffe38);
    sqlite3SelectDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe38);
    if (db_00->mallocFailed == '\x01') {
      fkTriggerDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                      (Trigger *)in_stack_fffffffffffffe38);
      local_60 = (Trigger *)0x0;
      goto LAB_00217d9d;
    }
    if (cVar1 == '\a') {
      local_b8->op = 0x8b;
    }
    else if ((cVar1 == '\n') && (in_RCX == 0)) {
      local_b8->op = 0x81;
    }
    else {
      local_b8->op = 0x82;
    }
    local_b8->pTrig = local_98;
    local_98->pSchema = *(Schema **)(in_RSI + 0x60);
    local_98->pTabSchema = *(Schema **)(in_RSI + 0x60);
    in_RDX[(long)(int)uVar5 + 6] = (long)local_98;
    uVar4 = 0x81;
    if (in_RCX != 0) {
      uVar4 = 0x82;
    }
    local_98->op = uVar4;
  }
  local_60 = local_98;
LAB_00217d9d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_60;
}

Assistant:

static Trigger *fkActionTrigger(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  FKey *pFKey,                    /* Foreign key to get action for */
  ExprList *pChanges              /* Change-list for UPDATE, NULL for DELETE */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  int action;                     /* One of OE_None, OE_Cascade etc. */
  Trigger *pTrigger;              /* Trigger definition to return */
  int iAction = (pChanges!=0);    /* 1 for UPDATE, 0 for DELETE */

  action = pFKey->aAction[iAction];
  if( (db->flags & SQLITE_FkNoAction) ) action = OE_None;
  if( action==OE_Restrict && (db->flags & SQLITE_DeferFKs) ){
    return 0;
  }
  pTrigger = pFKey->apTrigger[iAction];

  if( action!=OE_None && !pTrigger ){
    char const *zFrom;            /* Name of child table */
    int nFrom;                    /* Length in bytes of zFrom */
    Index *pIdx = 0;              /* Parent key index for this FK */
    int *aiCol = 0;               /* child table cols -> parent key cols */
    TriggerStep *pStep = 0;        /* First (only) step of trigger program */
    Expr *pWhere = 0;             /* WHERE clause of trigger step */
    ExprList *pList = 0;          /* Changes list if ON UPDATE CASCADE */
    Select *pSelect = 0;          /* If RESTRICT, "SELECT RAISE(...)" */
    int i;                        /* Iterator variable */
    Expr *pWhen = 0;              /* WHEN clause for the trigger */

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ) return 0;
    assert( aiCol || pFKey->nCol==1 );

    for(i=0; i<pFKey->nCol; i++){
      Token tOld = { "old", 3 };  /* Literal "old" token */
      Token tNew = { "new", 3 };  /* Literal "new" token */
      Token tFromCol;             /* Name of column in child table */
      Token tToCol;               /* Name of column in parent table */
      int iFromCol;               /* Idx of column in child table */
      Expr *pEq;                  /* tFromCol = OLD.tToCol */

      iFromCol = aiCol ? aiCol[i] : pFKey->aCol[0].iFrom;
      assert( iFromCol>=0 );
      assert( pIdx!=0 || (pTab->iPKey>=0 && pTab->iPKey<pTab->nCol) );
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
      sqlite3TokenInit(&tToCol,
                   pTab->aCol[pIdx ? pIdx->aiColumn[i] : pTab->iPKey].zCnName);
      sqlite3TokenInit(&tFromCol, pFKey->pFrom->aCol[iFromCol].zCnName);

      /* Create the expression "OLD.zToCol = zFromCol". It is important
      ** that the "OLD.zToCol" term is on the LHS of the = operator, so
      ** that the affinity and collation sequence associated with the
      ** parent table are used for the comparison. */
      pEq = sqlite3PExpr(pParse, TK_EQ,
          sqlite3PExpr(pParse, TK_DOT,
            sqlite3ExprAlloc(db, TK_ID, &tOld, 0),
            sqlite3ExprAlloc(db, TK_ID, &tToCol, 0)),
          sqlite3ExprAlloc(db, TK_ID, &tFromCol, 0)
      );
      pWhere = sqlite3ExprAnd(pParse, pWhere, pEq);

      /* For ON UPDATE, construct the next term of the WHEN clause.
      ** The final WHEN clause will be like this:
      **
      **    WHEN NOT(old.col1 IS new.col1 AND ... AND old.colN IS new.colN)
      */
      if( pChanges ){
        pEq = sqlite3PExpr(pParse, TK_IS,
            sqlite3PExpr(pParse, TK_DOT,
              sqlite3ExprAlloc(db, TK_ID, &tOld, 0),
              sqlite3ExprAlloc(db, TK_ID, &tToCol, 0)),
            sqlite3PExpr(pParse, TK_DOT,
              sqlite3ExprAlloc(db, TK_ID, &tNew, 0),
              sqlite3ExprAlloc(db, TK_ID, &tToCol, 0))
            );
        pWhen = sqlite3ExprAnd(pParse, pWhen, pEq);
      }

      if( action!=OE_Restrict && (action!=OE_Cascade || pChanges) ){
        Expr *pNew;
        if( action==OE_Cascade ){
          pNew = sqlite3PExpr(pParse, TK_DOT,
            sqlite3ExprAlloc(db, TK_ID, &tNew, 0),
            sqlite3ExprAlloc(db, TK_ID, &tToCol, 0));
        }else if( action==OE_SetDflt ){
          Column *pCol = pFKey->pFrom->aCol + iFromCol;
          Expr *pDflt;
          if( pCol->colFlags & COLFLAG_GENERATED ){
            testcase( pCol->colFlags & COLFLAG_VIRTUAL );
            testcase( pCol->colFlags & COLFLAG_STORED );
            pDflt = 0;
          }else{
            pDflt = sqlite3ColumnExpr(pFKey->pFrom, pCol);
          }
          if( pDflt ){
            pNew = sqlite3ExprDup(db, pDflt, 0);
          }else{
            pNew = sqlite3ExprAlloc(db, TK_NULL, 0, 0);
          }
        }else{
          pNew = sqlite3ExprAlloc(db, TK_NULL, 0, 0);
        }
        pList = sqlite3ExprListAppend(pParse, pList, pNew);
        sqlite3ExprListSetName(pParse, pList, &tFromCol, 0);
      }
    }
    sqlite3DbFree(db, aiCol);

    zFrom = pFKey->pFrom->zName;
    nFrom = sqlite3Strlen30(zFrom);

    if( action==OE_Restrict ){
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      SrcList *pSrc;
      Expr *pRaise;

      pRaise = sqlite3Expr(db, TK_STRING, "FOREIGN KEY constraint failed"),
      pRaise = sqlite3PExpr(pParse, TK_RAISE, pRaise, 0);
      if( pRaise ){
        pRaise->affExpr = OE_Abort;
      }
      pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
      if( pSrc ){
        assert( pSrc->nSrc==1 );
        pSrc->a[0].zName = sqlite3DbStrDup(db, zFrom);
        assert( pSrc->a[0].fg.fixedSchema==0 && pSrc->a[0].fg.isSubquery==0 );
        pSrc->a[0].u4.zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zDbSName);
      }
      pSelect = sqlite3SelectNew(pParse,
          sqlite3ExprListAppend(pParse, 0, pRaise),
          pSrc,
          pWhere,
          0, 0, 0, 0, 0
      );
      pWhere = 0;
    }

    /* Disable lookaside memory allocation */
    DisableLookaside;

    pTrigger = (Trigger *)sqlite3DbMallocZero(db,
        sizeof(Trigger) +         /* struct Trigger */
        sizeof(TriggerStep) +     /* Single step in trigger program */
        nFrom + 1                 /* Space for pStep->zTarget */
    );
    if( pTrigger ){
      pStep = pTrigger->step_list = (TriggerStep *)&pTrigger[1];
      pStep->zTarget = (char *)&pStep[1];
      memcpy((char *)pStep->zTarget, zFrom, nFrom);

      pStep->pWhere = sqlite3ExprDup(db, pWhere, EXPRDUP_REDUCE);
      pStep->pExprList = sqlite3ExprListDup(db, pList, EXPRDUP_REDUCE);
      pStep->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
      if( pWhen ){
        pWhen = sqlite3PExpr(pParse, TK_NOT, pWhen, 0);
        pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
      }
    }

    /* Re-enable the lookaside buffer, if it was disabled earlier. */
    EnableLookaside;

    sqlite3ExprDelete(db, pWhere);
    sqlite3ExprDelete(db, pWhen);
    sqlite3ExprListDelete(db, pList);
    sqlite3SelectDelete(db, pSelect);
    if( db->mallocFailed==1 ){
      fkTriggerDelete(db, pTrigger);
      return 0;
    }
    assert( pStep!=0 );
    assert( pTrigger!=0 );

    switch( action ){
      case OE_Restrict:
        pStep->op = TK_SELECT;
        break;
      case OE_Cascade:
        if( !pChanges ){
          pStep->op = TK_DELETE;
          break;
        }
        /* no break */ deliberate_fall_through
      default:
        pStep->op = TK_UPDATE;
    }
    pStep->pTrig = pTrigger;
    pTrigger->pSchema = pTab->pSchema;
    pTrigger->pTabSchema = pTab->pSchema;
    pFKey->apTrigger[iAction] = pTrigger;
    pTrigger->op = (pChanges ? TK_UPDATE : TK_DELETE);
  }

  return pTrigger;
}